

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

size_t __thiscall
Logger::logless<int,double,float,unsigned_long,int,double,float,unsigned_long>
          (Logger *this,uint8_t *pUsedBuffer,int t,double ts,float ts_1,unsigned_long ts_2,int ts_3,
          double ts_4,float ts_5,unsigned_long ts_6)

{
  *pUsedBuffer = 0xa6;
  *(int *)(pUsedBuffer + 1) = t;
  pUsedBuffer[5] = 0xac;
  *(double *)(pUsedBuffer + 6) = ts;
  pUsedBuffer[0xe] = 0xab;
  *(float *)(pUsedBuffer + 0xf) = ts_1;
  pUsedBuffer[0x13] = 0xa7;
  *(unsigned_long *)(pUsedBuffer + 0x14) = ts_2;
  pUsedBuffer[0x1c] = 0xa6;
  *(int *)(pUsedBuffer + 0x1d) = ts_3;
  pUsedBuffer[0x21] = 0xac;
  *(double *)(pUsedBuffer + 0x22) = ts_4;
  pUsedBuffer[0x2a] = 0xab;
  *(float *)(pUsedBuffer + 0x2b) = ts_5;
  pUsedBuffer[0x2f] = 0xa7;
  *(unsigned_long *)(pUsedBuffer + 0x30) = ts_6;
  pUsedBuffer[0x38] = '\0';
  return 0x39;
}

Assistant:

size_t logless(uint8_t* pUsedBuffer, T t, Ts... ts)
    {
        new (pUsedBuffer) TagType(TypeTraits<T>::type_id);
        pUsedBuffer += sizeof(TagType);
        new (pUsedBuffer) T(t);
        pUsedBuffer += sizeof(T);
        return logless(pUsedBuffer, ts...) + sizeof(TagType) + sizeof(T);
    }